

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPlatform.cpp
# Opt level: O0

uint8_t __thiscall GmmLib::PlatformInfo::ValidateCCS(PlatformInfo *this,GMM_TEXTURE_INFO *Surf)

{
  GMM_TEXTURE_INFO *Surf_local;
  PlatformInfo *this_local;
  
  if (((((int)Surf->Type < 2) || (6 < (int)Surf->Type)) || (4 < (int)Surf->Type)) &&
     ((Surf->Type != RESOURCE_2D || (Surf->MaxLod != 0)))) {
    this_local._7_1_ = '\0';
  }
  else if ((((ulong)(Surf->Flags).Info >> 0x1d & 1) == 0) ||
          (((ulong)(Surf->Flags).Info >> 0x14 & 1) == 0)) {
    this_local._7_1_ = '\x01';
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GmmLib::PlatformInfo::ValidateCCS(GMM_TEXTURE_INFO &Surf)
{
    if(!(                                                             //--- Legitimate CCS Case ----------------------------------------
       ((Surf.Type >= RESOURCE_2D && Surf.Type <= RESOURCE_BUFFER) && //Not supported: 1D; Supported: Buffer, 2D, 3D, cube, Arrays, mip-maps, MSAA, Depth/Stencil
        (Surf.Type <= RESOURCE_CUBE)) ||
       (Surf.Type == RESOURCE_2D && Surf.MaxLod == 0)))
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage!");
        return 0;
    }

    if(Surf.Flags.Info.RenderCompressed && Surf.Flags.Info.MediaCompressed)
    {
        GMM_ASSERTDPF(0, "Invalid CCS usage - can't be both RC and MC!");
        return 0;
    }

    return 1;
}